

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paint.h
# Opt level: O0

void gimage::validRange<float>(Image<float,_gimage::PixelTraits<float>_> *image,float from,float to)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  float in_XMM0_Da;
  store_t_conflict sVar5;
  float in_XMM1_Da;
  int j;
  float v;
  long i;
  long k;
  int d;
  undefined4 in_stack_ffffffffffffffa8;
  store_t_conflict in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Image<float,_gimage::PixelTraits<float>_> *this;
  int local_30;
  long local_28;
  Image<float,_gimage::PixelTraits<float>_> *local_20;
  int local_14;
  
  for (local_14 = 0; iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDI),
      local_14 < iVar2; local_14 = local_14 + 1) {
    local_20 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
    while (this = local_20, lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RDI),
          (long)this < lVar3) {
      local_28 = 0;
      while (lVar3 = local_28, lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI),
            lVar3 < lVar4) {
        sVar5 = Image<float,_gimage::PixelTraits<float>_>::get
                          (in_RDI,local_28,(long)local_20,local_14);
        if (((sVar5 < in_XMM0_Da) || (in_XMM1_Da < sVar5)) &&
           (bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                              ((Image<float,_gimage::PixelTraits<float>_> *)
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffac), bVar1)) {
          local_30 = 0;
          while (in_stack_ffffffffffffffb4 = local_30,
                iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RDI),
                in_stack_ffffffffffffffb4 < iVar2) {
            Image<float,_gimage::PixelTraits<float>_>::setInvalid
                      (this,lVar3,CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            local_30 = local_30 + 1;
          }
        }
        local_28 = local_28 + 1;
      }
      local_20 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&local_20->depth + 1);
    }
  }
  return;
}

Assistant:

void validRange(Image<T> &image, T from, T to)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=image.get(i, k, d);

        if ((v < from || v > to) && image.isValidS(v))
        {
          for (int j=0; j<image.getDepth(); j++)
          {
            image.setInvalid(i, k, j);
          }
        }
      }
    }
  }
}